

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_char>::get_index<unsigned_char>
          (CImg<unsigned_int> *__return_storage_ptr__,CImg<unsigned_char> *this,
          CImg<unsigned_char> *colormap,float dithering,bool map_indexes)

{
  byte bVar1;
  uint uVar2;
  uint size_z;
  int iVar3;
  byte *pbVar4;
  uint *puVar5;
  ulong uVar6;
  float *pfVar7;
  CImgArgumentException *this_00;
  long lVar8;
  byte *pbVar9;
  uint *puVar10;
  int iVar11;
  float *pfVar12;
  long lVar13;
  float *pfVar14;
  uint *puVar15;
  float *pfVar16;
  float *pfVar17;
  uint uVar18;
  byte *pbVar19;
  float *pfVar20;
  byte *pbVar21;
  float *pfVar22;
  uint size_c;
  uchar *ptrp_end;
  byte *pbVar23;
  byte *pbVar24;
  uchar *puVar25;
  uchar *ptrp_end_2;
  byte *pbVar26;
  char *pcVar27;
  uchar *ptrp_end_1;
  ulong uVar28;
  long lVar29;
  long lVar30;
  uint uVar31;
  long lVar32;
  uint *puVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  long local_e8;
  float *local_e0;
  uint *local_d8;
  long local_c8;
  Tfloat valm;
  CImg<unsigned_int> *local_b8;
  float *local_b0;
  CImg<unsigned_char> *local_a8;
  float *local_a0;
  float *local_98;
  uchar *local_90;
  long local_88;
  float *local_80;
  uchar *local_78;
  CImg<unsigned_char> local_70;
  CImg<float> cache;
  
  uVar31 = this->_spectrum;
  local_a8 = colormap;
  if (colormap->_spectrum != uVar31) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    pcVar27 = "non-";
    if (this->_is_shared != false) {
      pcVar27 = "";
    }
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::index(): Instance and specified colormap (%u,%u,%u,%u,%p) have incompatible dimensions."
               ,(ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum,
               this->_data,pcVar27,"unsigned char",(ulong)local_a8->_width,(ulong)local_a8->_height,
               (ulong)local_a8->_depth,(ulong)local_a8->_spectrum,local_a8->_data);
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgException::~CImgException);
  }
  if ((uVar31 != 0) && (this->_data != (uchar *)0x0)) {
    uVar18 = this->_width;
    if (uVar18 != 0) {
      uVar2 = this->_height;
      if (uVar2 != 0) {
        size_z = this->_depth;
        if (size_z != 0) {
          lVar32 = (ulong)uVar2 * (ulong)uVar18 * (ulong)size_z;
          lVar30 = (ulong)colormap->_depth * (ulong)colormap->_height * (ulong)colormap->_width;
          size_c = 1;
          if (map_indexes) {
            size_c = uVar31;
          }
          CImg<unsigned_int>::CImg(__return_storage_ptr__,uVar18,uVar2,size_z,size_c);
          if (0.0 < dithering) {
            puVar33 = __return_storage_ptr__->_data;
            valm = 0.0;
            local_b8 = __return_storage_ptr__;
            pbVar4 = max_min<float>(this,&valm);
            fVar34 = (float)*pbVar4;
            if ((valm == fVar34) && (0.0 <= valm)) {
              valm = 0.0;
              fVar34 = 255.0;
            }
            get_crop(&local_70,this,-1,0,0,0,this->_width,1,0,this->_spectrum - 1,0);
            CImg<float>::CImg<unsigned_char>(&cache,&local_70);
            fVar40 = 1.0;
            if (dithering <= 1.0) {
              fVar40 = dithering;
            }
            if ((local_70._is_shared == false) && (local_70._data != (uchar *)0x0)) {
              operator_delete__(local_70._data);
            }
            fVar40 = fVar40 * 0.0625;
            pfVar7 = cache._data + 1;
            local_e0 = cache._data + (ulong)cache._width + 1;
            lVar8 = (ulong)cache._height * (ulong)cache._width * (ulong)cache._depth;
            uVar31 = this->_depth;
            uVar18 = this->_spectrum;
            local_80 = cache._data;
            if (uVar18 == 3) {
              if (0 < (int)uVar31) {
                local_b0 = (float *)(puVar33 + lVar32);
                local_a0 = local_b0 + lVar32;
                local_90 = (uchar *)0x0;
                do {
                  uVar28 = (ulong)this->_height;
                  pfVar14 = local_e0;
                  if (0 < (int)this->_height) {
                    local_78 = this->_data;
                    pbVar4 = local_a8->_data;
                    lVar13 = 0;
                    do {
                      local_88 = lVar13;
                      pfVar14 = pfVar7;
                      if ((local_88 < (int)uVar28 + -2) &&
                         (uVar6 = (ulong)(int)this->_width, 0 < (long)uVar6)) {
                        pbVar23 = local_78 +
                                  (uVar28 & 0xffffffff) * (long)local_90 * uVar6 +
                                  (local_88 + 1) * uVar6;
                        pfVar7 = local_e0;
                        do {
                          *pfVar7 = (float)*pbVar23;
                          pfVar7[lVar8] = (float)pbVar23[lVar32];
                          pbVar21 = pbVar23 + lVar32 * 2;
                          pbVar23 = pbVar23 + 1;
                          pfVar7[lVar8 * 2] = (float)*pbVar21;
                          pfVar7 = pfVar7 + 1;
                          uVar31 = (int)uVar6 - 1;
                          uVar6 = (ulong)uVar31;
                        } while (uVar31 != 0);
                      }
                      if (0 < (int)this->_width) {
                        pfVar7 = local_e0 + lVar8;
                        pfVar16 = pfVar7 + lVar8;
                        pfVar17 = pfVar14 + lVar8;
                        pfVar22 = pfVar17 + lVar8;
                        iVar3 = 0;
                        pfVar12 = local_e0;
                        pfVar20 = pfVar14;
                        do {
                          fVar35 = *pfVar20;
                          fVar36 = fVar34;
                          if (fVar35 <= fVar34) {
                            fVar36 = fVar35;
                          }
                          fVar37 = (float)(-(uint)(fVar35 < valm) & (uint)valm |
                                          ~-(uint)(fVar35 < valm) & (uint)fVar36);
                          fVar35 = *pfVar17;
                          fVar36 = fVar34;
                          if (fVar35 <= fVar34) {
                            fVar36 = fVar35;
                          }
                          fVar36 = (float)(-(uint)(fVar35 < valm) & (uint)valm |
                                          ~-(uint)(fVar35 < valm) & (uint)fVar36);
                          fVar35 = *pfVar22;
                          fVar38 = fVar34;
                          if (fVar35 <= fVar34) {
                            fVar38 = fVar35;
                          }
                          fVar35 = (float)(-(uint)(fVar35 < valm) & (uint)valm |
                                          ~-(uint)(fVar35 < valm) & (uint)fVar38);
                          pbVar23 = pbVar4;
                          if (0 < lVar30) {
                            fVar38 = 3.4028235e+38;
                            pbVar21 = pbVar4;
                            do {
                              fVar39 = ((float)pbVar21[lVar30 * 2] - fVar35) *
                                       ((float)pbVar21[lVar30 * 2] - fVar35) +
                                       ((float)*pbVar21 - fVar37) * ((float)*pbVar21 - fVar37) +
                                       ((float)pbVar21[lVar30] - fVar36) *
                                       ((float)pbVar21[lVar30] - fVar36);
                              if (fVar39 < fVar38) {
                                pbVar23 = pbVar21;
                              }
                              pbVar21 = pbVar21 + 1;
                              if (fVar38 <= fVar39) {
                                fVar39 = fVar38;
                              }
                              fVar38 = fVar39;
                            } while (pbVar21 < pbVar4 + lVar30);
                          }
                          *pfVar20 = fVar37;
                          bVar1 = *pbVar23;
                          *pfVar17 = fVar36;
                          fVar37 = (fVar37 - (float)bVar1) * fVar40;
                          fVar36 = (fVar36 - (float)pbVar23[lVar30]) * fVar40;
                          *pfVar22 = fVar35;
                          fVar35 = (fVar35 - (float)pbVar23[lVar30 * 2]) * fVar40;
                          pfVar20[1] = fVar37 * 7.0 + pfVar20[1];
                          pfVar17[1] = fVar36 * 7.0 + pfVar17[1];
                          pfVar22[1] = fVar35 * 7.0 + pfVar22[1];
                          pfVar12[-1] = fVar37 * 3.0 + pfVar12[-1];
                          pfVar7[-1] = fVar36 * 3.0 + pfVar7[-1];
                          pfVar16[-1] = fVar35 * 3.0 + pfVar16[-1];
                          *pfVar12 = fVar37 * 5.0 + *pfVar12;
                          *pfVar7 = fVar36 * 5.0 + *pfVar7;
                          *pfVar16 = fVar35 * 5.0 + *pfVar16;
                          pfVar12[1] = fVar37 + pfVar12[1];
                          pfVar7[1] = fVar36 + pfVar7[1];
                          pfVar16[1] = fVar35 + pfVar16[1];
                          if (map_indexes) {
                            *puVar33 = (uint)*pbVar23;
                            *local_b0 = (float)(uint)pbVar23[lVar30];
                            local_b0 = local_b0 + 1;
                            *local_a0 = (float)(uint)pbVar23[lVar30 * 2];
                            local_a0 = local_a0 + 1;
                          }
                          else {
                            local_e8._0_4_ = (int)pbVar4;
                            *puVar33 = (int)pbVar23 - (int)local_e8;
                          }
                          pfVar20 = pfVar20 + 1;
                          pfVar17 = pfVar17 + 1;
                          pfVar22 = pfVar22 + 1;
                          pfVar12 = pfVar12 + 1;
                          pfVar7 = pfVar7 + 1;
                          pfVar16 = pfVar16 + 1;
                          puVar33 = puVar33 + 1;
                          iVar3 = iVar3 + 1;
                        } while (iVar3 < (int)this->_width);
                      }
                      uVar28 = (ulong)(int)this->_height;
                      pfVar7 = local_e0;
                      lVar13 = local_88 + 1;
                      local_e0 = pfVar14;
                      local_98 = pfVar14;
                    } while (local_88 + 1 < (long)uVar28);
                  }
                  local_90 = local_90 + 1;
                  local_e0 = pfVar14;
                } while ((long)local_90 < (long)(int)this->_depth);
              }
            }
            else if (uVar18 == 2) {
              if (0 < (int)uVar31) {
                local_d8 = puVar33 + lVar32;
                local_a0 = (float *)0x0;
                do {
                  uVar28 = (ulong)this->_height;
                  pfVar14 = local_e0;
                  if (0 < (int)this->_height) {
                    local_98 = (float *)this->_data;
                    pbVar4 = local_a8->_data;
                    pfVar16 = (float *)0x0;
                    do {
                      local_b0 = pfVar16;
                      pfVar14 = pfVar7;
                      if (((long)local_b0 < (long)((int)uVar28 + -2)) &&
                         (uVar6 = (ulong)(int)this->_width, 0 < (long)uVar6)) {
                        pbVar23 = (byte *)((long)local_98 +
                                          (uVar28 & 0xffffffff) * (long)local_a0 * uVar6 +
                                          ((long)local_b0 + 1) * uVar6);
                        pfVar7 = local_e0;
                        do {
                          *pfVar7 = (float)*pbVar23;
                          pbVar21 = pbVar23 + lVar32;
                          pbVar23 = pbVar23 + 1;
                          pfVar7[lVar8] = (float)*pbVar21;
                          pfVar7 = pfVar7 + 1;
                          uVar31 = (int)uVar6 - 1;
                          uVar6 = (ulong)uVar31;
                        } while (uVar31 != 0);
                      }
                      if (0 < (int)this->_width) {
                        pfVar7 = local_e0 + lVar8;
                        pfVar16 = pfVar14 + lVar8;
                        iVar3 = 0;
                        pfVar17 = local_e0;
                        pfVar22 = pfVar14;
                        do {
                          fVar35 = *pfVar22;
                          fVar36 = fVar34;
                          if (fVar35 <= fVar34) {
                            fVar36 = fVar35;
                          }
                          fVar36 = (float)(-(uint)(fVar35 < valm) & (uint)valm |
                                          ~-(uint)(fVar35 < valm) & (uint)fVar36);
                          fVar35 = *pfVar16;
                          fVar37 = fVar34;
                          if (fVar35 <= fVar34) {
                            fVar37 = fVar35;
                          }
                          fVar35 = (float)(-(uint)(fVar35 < valm) & (uint)valm |
                                          ~-(uint)(fVar35 < valm) & (uint)fVar37);
                          pbVar23 = pbVar4;
                          if (0 < lVar30) {
                            pbVar21 = pbVar4;
                            fVar37 = 3.4028235e+38;
                            do {
                              fVar38 = ((float)*pbVar21 - fVar36) * ((float)*pbVar21 - fVar36) +
                                       ((float)pbVar21[lVar30] - fVar35) *
                                       ((float)pbVar21[lVar30] - fVar35);
                              if (fVar38 < fVar37) {
                                pbVar23 = pbVar21;
                              }
                              pbVar21 = pbVar21 + 1;
                              if (fVar37 <= fVar38) {
                                fVar38 = fVar37;
                              }
                              fVar37 = fVar38;
                            } while (pbVar21 < pbVar4 + lVar30);
                          }
                          *pfVar22 = fVar36;
                          fVar36 = (fVar36 - (float)*pbVar23) * fVar40;
                          *pfVar16 = fVar35;
                          fVar35 = (fVar35 - (float)pbVar23[lVar30]) * fVar40;
                          pfVar22[1] = fVar36 * 7.0 + pfVar22[1];
                          pfVar16[1] = fVar35 * 7.0 + pfVar16[1];
                          pfVar17[-1] = fVar36 * 3.0 + pfVar17[-1];
                          pfVar7[-1] = fVar35 * 3.0 + pfVar7[-1];
                          *pfVar17 = fVar36 * 5.0 + *pfVar17;
                          *pfVar7 = fVar35 * 5.0 + *pfVar7;
                          pfVar17[1] = fVar36 + pfVar17[1];
                          pfVar7[1] = fVar35 + pfVar7[1];
                          if (map_indexes) {
                            *puVar33 = (uint)*pbVar23;
                            *local_d8 = (uint)pbVar23[lVar30];
                            local_d8 = local_d8 + 1;
                          }
                          else {
                            *puVar33 = (int)pbVar23 - (int)pbVar4;
                          }
                          pfVar22 = pfVar22 + 1;
                          pfVar16 = pfVar16 + 1;
                          pfVar17 = pfVar17 + 1;
                          pfVar7 = pfVar7 + 1;
                          puVar33 = puVar33 + 1;
                          iVar3 = iVar3 + 1;
                        } while (iVar3 < (int)this->_width);
                      }
                      uVar28 = (ulong)(int)this->_height;
                      pfVar7 = local_e0;
                      pfVar16 = (float *)((long)local_b0 + 1);
                      local_e0 = pfVar14;
                    } while ((long)local_b0 + 1 < (long)uVar28);
                  }
                  local_a0 = (float *)((long)local_a0 + 1);
                  local_e0 = pfVar14;
                } while ((long)local_a0 < (long)(int)this->_depth);
              }
            }
            else if (uVar18 == 1) {
              if (0 < (int)uVar31) {
                local_d8 = (uint *)0x0;
                do {
                  uVar28 = (ulong)this->_height;
                  if (0 < (int)this->_height) {
                    puVar25 = this->_data;
                    pbVar4 = local_a8->_data;
                    lVar32 = 1;
                    lVar8 = 0;
                    pfVar14 = pfVar7;
                    do {
                      pfVar7 = local_e0;
                      local_e0 = pfVar14;
                      if (lVar8 < (int)uVar28 + -2) {
                        uVar31 = this->_width;
                        if (0 < (long)(int)uVar31) {
                          lVar13 = 0;
                          do {
                            pfVar7[lVar13] =
                                 (float)puVar25[lVar13 + ((uVar28 & 0xffffffff) * (long)local_d8 +
                                                         lVar32) * (long)(int)uVar31];
                            lVar13 = lVar13 + 1;
                          } while (uVar31 != (uint)lVar13);
                        }
                      }
                      if (0 < (int)this->_width) {
                        iVar3 = 0;
                        pfVar14 = pfVar7;
                        pfVar16 = local_e0;
                        do {
                          fVar35 = *pfVar16;
                          fVar36 = fVar34;
                          if (fVar35 <= fVar34) {
                            fVar36 = fVar35;
                          }
                          fVar35 = (float)(-(uint)(fVar35 < valm) & (uint)valm |
                                          ~-(uint)(fVar35 < valm) & (uint)fVar36);
                          pbVar23 = pbVar4;
                          if (0 < lVar30) {
                            pbVar21 = pbVar4;
                            fVar36 = 3.4028235e+38;
                            do {
                              fVar37 = ((float)*pbVar21 - fVar35) * ((float)*pbVar21 - fVar35);
                              if (fVar37 < fVar36) {
                                pbVar23 = pbVar21;
                              }
                              pbVar21 = pbVar21 + 1;
                              if (fVar36 <= fVar37) {
                                fVar37 = fVar36;
                              }
                              fVar36 = fVar37;
                            } while (pbVar21 < pbVar4 + lVar30);
                          }
                          *pfVar16 = fVar35;
                          fVar35 = (fVar35 - (float)*pbVar23) * fVar40;
                          pfVar16[1] = fVar35 * 7.0 + pfVar16[1];
                          pfVar14[-1] = fVar35 * 3.0 + pfVar14[-1];
                          *pfVar14 = fVar35 * 5.0 + *pfVar14;
                          pfVar14[1] = fVar35 + pfVar14[1];
                          if (map_indexes) {
                            uVar31 = (uint)*pbVar23;
                          }
                          else {
                            uVar31 = (int)pbVar23 - (int)pbVar4;
                          }
                          pfVar16 = pfVar16 + 1;
                          pfVar14 = pfVar14 + 1;
                          *puVar33 = uVar31;
                          puVar33 = puVar33 + 1;
                          iVar3 = iVar3 + 1;
                        } while (iVar3 < (int)this->_width);
                      }
                      lVar8 = lVar8 + 1;
                      uVar28 = (ulong)(int)this->_height;
                      lVar32 = lVar32 + 1;
                      pfVar14 = pfVar7;
                    } while (lVar8 < (long)uVar28);
                  }
                  local_d8 = (uint *)((long)local_d8 + 1);
                } while ((long)local_d8 < (long)(int)this->_depth);
              }
            }
            else if (0 < (int)uVar31) {
              local_88 = 0;
              do {
                uVar28 = (ulong)this->_height;
                pfVar14 = local_e0;
                if (0 < (int)this->_height) {
                  local_90 = this->_data;
                  pbVar4 = local_a8->_data;
                  local_98 = (float *)0x1;
                  pfVar16 = (float *)0x0;
                  do {
                    local_a0 = pfVar16;
                    pfVar14 = pfVar7;
                    if (((long)local_a0 < (long)((int)uVar28 + -2)) &&
                       (uVar31 = this->_spectrum, 0 < (long)(int)uVar31)) {
                      uVar18 = this->_width;
                      uVar2 = this->_depth;
                      puVar25 = local_90 +
                                (long)(local_88 * (uVar28 & 0xffffffff) + (long)local_98) *
                                (ulong)uVar18;
                      lVar13 = 0;
                      pfVar7 = local_e0;
                      do {
                        if (0 < (int)uVar18) {
                          lVar29 = 0;
                          do {
                            pfVar7[lVar29] = (float)puVar25[lVar29];
                            lVar29 = lVar29 + 1;
                          } while (uVar18 != (uint)lVar29);
                        }
                        lVar13 = lVar13 + 1;
                        puVar25 = puVar25 + (uVar28 & 0xffffffff) * (ulong)uVar18 * (ulong)uVar2;
                        pfVar7 = pfVar7 + lVar8;
                      } while (lVar13 != (int)uVar31);
                    }
                    if (0 < (int)this->_width) {
                      iVar3 = 0;
                      pfVar7 = local_e0;
                      pfVar16 = pfVar14;
                      do {
                        pbVar23 = pbVar4;
                        if (0 < lVar30) {
                          uVar31 = this->_spectrum;
                          pbVar21 = pbVar4;
                          fVar35 = 3.4028235e+38;
                          do {
                            fVar36 = 0.0;
                            pbVar24 = pbVar21;
                            pfVar17 = pfVar16;
                            uVar18 = uVar31;
                            if (0 < (int)uVar31) {
                              do {
                                fVar37 = *pfVar17;
                                fVar38 = fVar34;
                                if (fVar37 <= fVar34) {
                                  fVar38 = fVar37;
                                }
                                fVar37 = (float)(-(uint)(fVar37 < valm) & (uint)valm |
                                                ~-(uint)(fVar37 < valm) & (uint)fVar38);
                                *pfVar17 = fVar37;
                                fVar37 = fVar37 - (float)*pbVar24;
                                fVar36 = fVar36 + fVar37 * fVar37;
                                uVar18 = uVar18 - 1;
                                pbVar24 = pbVar24 + lVar30;
                                pfVar17 = pfVar17 + lVar8;
                              } while (uVar18 != 0);
                            }
                            pbVar24 = pbVar21;
                            if (fVar35 <= fVar36) {
                              fVar36 = fVar35;
                              pbVar24 = pbVar23;
                            }
                            pbVar23 = pbVar24;
                            pbVar21 = pbVar21 + 1;
                            fVar35 = fVar36;
                          } while (pbVar21 < pbVar4 + lVar30);
                        }
                        uVar31 = this->_spectrum;
                        if (0 < (int)uVar31) {
                          lVar13 = 4;
                          pbVar21 = pbVar23;
                          do {
                            fVar35 = (*(float *)((long)pfVar16 + lVar13 + -4) - (float)*pbVar21) *
                                     fVar40;
                            *(float *)((long)pfVar16 + lVar13) =
                                 fVar35 * 7.0 + *(float *)((long)pfVar16 + lVar13);
                            *(float *)((long)pfVar7 + lVar13 + -8) =
                                 fVar35 * 3.0 + *(float *)((long)pfVar7 + lVar13 + -8);
                            *(float *)((long)pfVar7 + lVar13 + -4) =
                                 fVar35 * 5.0 + *(float *)((long)pfVar7 + lVar13 + -4);
                            *(float *)((long)pfVar7 + lVar13) =
                                 fVar35 + *(float *)((long)pfVar7 + lVar13);
                            pbVar21 = pbVar21 + lVar30;
                            lVar13 = lVar13 + lVar8 * 4;
                            uVar31 = uVar31 - 1;
                          } while (uVar31 != 0);
                        }
                        if (map_indexes) {
                          if (0 < (int)this->_spectrum) {
                            iVar11 = 0;
                            puVar15 = puVar33;
                            do {
                              *puVar15 = (uint)*pbVar23;
                              pbVar23 = pbVar23 + lVar30;
                              iVar11 = iVar11 + 1;
                              puVar15 = puVar15 + lVar32;
                            } while (iVar11 < (int)this->_spectrum);
                          }
                        }
                        else {
                          local_e8._0_4_ = (int)pbVar4;
                          *puVar33 = (int)pbVar23 - (int)local_e8;
                        }
                        pfVar16 = pfVar16 + 1;
                        pfVar7 = pfVar7 + 1;
                        puVar33 = puVar33 + 1;
                        iVar3 = iVar3 + 1;
                      } while (iVar3 < (int)this->_width);
                    }
                    uVar28 = (ulong)(int)this->_height;
                    local_98 = (float *)((long)local_98 + 1);
                    pfVar7 = local_e0;
                    pfVar16 = (float *)((long)local_a0 + 1);
                    local_e0 = pfVar14;
                    local_b0 = pfVar14;
                  } while ((long)local_a0 + 1 < (long)uVar28);
                }
                local_88 = local_88 + 1;
                local_e0 = pfVar14;
              } while (local_88 < (int)this->_depth);
            }
            if (cache._data == (float *)0x0 || cache._is_shared != false) {
              return local_b8;
            }
            operator_delete__(cache._data);
            return local_b8;
          }
          uVar31 = this->_depth;
          uVar18 = this->_spectrum;
          if (uVar18 == 1) {
            if ((int)uVar31 < 1) {
              return __return_storage_ptr__;
            }
            puVar33 = __return_storage_ptr__->_data;
            puVar25 = this->_data;
            lVar32 = 0;
            do {
              uVar28 = (ulong)this->_height;
              if (0 < (int)this->_height) {
                pbVar4 = local_a8->_data;
                lVar8 = 0;
                do {
                  uVar6 = (ulong)this->_width;
                  if (uVar6 != 0) {
                    pbVar21 = puVar25 + (uVar28 & 0xffffffff) * lVar32 * uVar6 + lVar8 * uVar6;
                    pbVar23 = pbVar21 + uVar6;
                    puVar15 = puVar33 + lVar8 * (ulong)__return_storage_ptr__->_width +
                                        (ulong)__return_storage_ptr__->_height *
                                        (ulong)__return_storage_ptr__->_width * lVar32;
                    do {
                      pbVar24 = pbVar4;
                      if (0 < lVar30) {
                        fVar34 = 3.4028235e+38;
                        pbVar26 = pbVar4;
                        do {
                          fVar40 = ((float)*pbVar26 - (float)*pbVar21) *
                                   ((float)*pbVar26 - (float)*pbVar21);
                          if (fVar40 < fVar34) {
                            pbVar24 = pbVar26;
                          }
                          pbVar26 = pbVar26 + 1;
                          if (fVar34 <= fVar40) {
                            fVar40 = fVar34;
                          }
                          fVar34 = fVar40;
                        } while (pbVar26 < pbVar4 + lVar30);
                      }
                      if (map_indexes) {
                        uVar31 = (uint)*pbVar24;
                      }
                      else {
                        uVar31 = (int)pbVar24 - (int)pbVar4;
                      }
                      pbVar21 = pbVar21 + 1;
                      *puVar15 = uVar31;
                      puVar15 = puVar15 + 1;
                    } while (pbVar21 < pbVar23);
                  }
                  lVar8 = lVar8 + 1;
                  uVar28 = (ulong)(int)this->_height;
                } while (lVar8 < (long)uVar28);
              }
              lVar32 = lVar32 + 1;
            } while (lVar32 < (int)this->_depth);
            return __return_storage_ptr__;
          }
          if (uVar18 != 2) {
            if (uVar18 != 3) {
              if ((int)uVar31 < 1) {
                return __return_storage_ptr__;
              }
              puVar33 = __return_storage_ptr__->_data;
              puVar25 = this->_data;
              local_e8 = 0;
              do {
                uVar28 = (ulong)this->_height;
                if (0 < (int)this->_height) {
                  pbVar4 = local_a8->_data;
                  local_c8 = 0;
                  do {
                    uVar6 = (ulong)this->_width;
                    if (uVar6 != 0) {
                      pbVar23 = puVar25 + (uVar28 & 0xffffffff) * local_e8 * uVar6 +
                                          local_c8 * uVar6;
                      pbVar21 = pbVar23 + uVar6;
                      puVar15 = puVar33 + local_c8 * (ulong)__return_storage_ptr__->_width +
                                          (ulong)__return_storage_ptr__->_height *
                                          (ulong)__return_storage_ptr__->_width * local_e8;
                      do {
                        pbVar24 = pbVar4;
                        if (0 < lVar30) {
                          fVar34 = 3.4028235e+38;
                          pbVar26 = pbVar4;
                          do {
                            fVar40 = 0.0;
                            pbVar19 = pbVar26;
                            pbVar9 = pbVar23;
                            uVar31 = this->_spectrum;
                            if (0 < (int)this->_spectrum) {
                              do {
                                fVar40 = fVar40 + ((float)*pbVar9 - (float)*pbVar19) *
                                                  ((float)*pbVar9 - (float)*pbVar19);
                                uVar31 = uVar31 - 1;
                                pbVar19 = pbVar19 + lVar30;
                                pbVar9 = pbVar9 + lVar32;
                              } while (uVar31 != 0);
                            }
                            pbVar19 = pbVar26;
                            if (fVar34 <= fVar40) {
                              fVar40 = fVar34;
                              pbVar19 = pbVar24;
                            }
                            pbVar24 = pbVar19;
                            fVar34 = fVar40;
                            pbVar26 = pbVar26 + 1;
                          } while (pbVar26 < pbVar4 + lVar30);
                        }
                        if (map_indexes) {
                          if (0 < (int)this->_spectrum) {
                            iVar3 = 0;
                            puVar10 = puVar15;
                            do {
                              *puVar10 = (uint)*pbVar24;
                              pbVar24 = pbVar24 + lVar30;
                              iVar3 = iVar3 + 1;
                              puVar10 = puVar10 + lVar32;
                            } while (iVar3 < (int)this->_spectrum);
                          }
                        }
                        else {
                          *puVar15 = (int)pbVar24 - (int)pbVar4;
                        }
                        puVar15 = puVar15 + 1;
                        pbVar23 = pbVar23 + 1;
                      } while (pbVar23 < pbVar21);
                    }
                    local_c8 = local_c8 + 1;
                    uVar28 = (ulong)(int)this->_height;
                  } while (local_c8 < (long)uVar28);
                }
                local_e8 = local_e8 + 1;
              } while (local_e8 < (int)this->_depth);
              return __return_storage_ptr__;
            }
            if ((int)uVar31 < 1) {
              return __return_storage_ptr__;
            }
            puVar33 = __return_storage_ptr__->_data;
            puVar25 = this->_data;
            local_c8 = 0;
            do {
              uVar28 = (ulong)this->_height;
              if (0 < (int)this->_height) {
                pbVar4 = local_a8->_data;
                lVar8 = 0;
                do {
                  uVar6 = (ulong)this->_width;
                  if (uVar6 != 0) {
                    pbVar26 = puVar25 + (uVar28 & 0xffffffff) * local_c8 * uVar6 + lVar8 * uVar6;
                    pbVar24 = pbVar26 + uVar6;
                    pbVar23 = pbVar26 + lVar32;
                    pbVar21 = pbVar23 + lVar32;
                    puVar15 = puVar33 + lVar8 * (ulong)__return_storage_ptr__->_width +
                                        (ulong)__return_storage_ptr__->_height *
                                        (ulong)__return_storage_ptr__->_width * local_c8;
                    puVar10 = puVar15 + lVar32;
                    puVar5 = puVar10 + lVar32;
                    do {
                      pbVar19 = pbVar4;
                      if (0 < lVar30) {
                        pbVar9 = pbVar4;
                        fVar34 = 3.4028235e+38;
                        do {
                          fVar40 = ((float)pbVar9[lVar30 * 2] - (float)*pbVar21) *
                                   ((float)pbVar9[lVar30 * 2] - (float)*pbVar21) +
                                   ((float)*pbVar9 - (float)*pbVar26) *
                                   ((float)*pbVar9 - (float)*pbVar26) +
                                   ((float)pbVar9[lVar30] - (float)*pbVar23) *
                                   ((float)pbVar9[lVar30] - (float)*pbVar23);
                          if (fVar40 < fVar34) {
                            pbVar19 = pbVar9;
                          }
                          pbVar9 = pbVar9 + 1;
                          if (fVar34 <= fVar40) {
                            fVar40 = fVar34;
                          }
                          fVar34 = fVar40;
                        } while (pbVar9 < pbVar4 + lVar30);
                      }
                      if (map_indexes) {
                        *puVar15 = (uint)*pbVar19;
                        *puVar10 = (uint)pbVar19[lVar30];
                        puVar10 = puVar10 + 1;
                        *puVar5 = (uint)pbVar19[lVar30 * 2];
                        puVar5 = puVar5 + 1;
                      }
                      else {
                        *puVar15 = (int)pbVar19 - (int)pbVar4;
                      }
                      pbVar26 = pbVar26 + 1;
                      pbVar23 = pbVar23 + 1;
                      pbVar21 = pbVar21 + 1;
                      puVar15 = puVar15 + 1;
                    } while (pbVar26 < pbVar24);
                  }
                  lVar8 = lVar8 + 1;
                  uVar28 = (ulong)(int)this->_height;
                } while (lVar8 < (long)uVar28);
              }
              local_c8 = local_c8 + 1;
            } while (local_c8 < (int)this->_depth);
            return __return_storage_ptr__;
          }
          if ((int)uVar31 < 1) {
            return __return_storage_ptr__;
          }
          puVar33 = __return_storage_ptr__->_data;
          puVar25 = this->_data;
          lVar8 = 0;
          do {
            uVar28 = (ulong)this->_height;
            if (0 < (int)this->_height) {
              pbVar4 = local_a8->_data;
              lVar13 = 0;
              do {
                uVar6 = (ulong)this->_width;
                if (uVar6 != 0) {
                  pbVar24 = puVar25 + (uVar28 & 0xffffffff) * lVar8 * uVar6 + lVar13 * uVar6;
                  pbVar21 = pbVar24 + uVar6;
                  pbVar23 = pbVar24 + lVar32;
                  puVar15 = puVar33 + lVar13 * (ulong)__return_storage_ptr__->_width +
                                      (ulong)__return_storage_ptr__->_height *
                                      (ulong)__return_storage_ptr__->_width * lVar8;
                  puVar10 = puVar15 + lVar32;
                  do {
                    pbVar26 = pbVar4;
                    if (0 < lVar30) {
                      fVar34 = 3.4028235e+38;
                      pbVar19 = pbVar4;
                      do {
                        fVar40 = ((float)*pbVar19 - (float)*pbVar24) *
                                 ((float)*pbVar19 - (float)*pbVar24) +
                                 ((float)pbVar19[lVar30] - (float)*pbVar23) *
                                 ((float)pbVar19[lVar30] - (float)*pbVar23);
                        if (fVar40 < fVar34) {
                          pbVar26 = pbVar19;
                        }
                        pbVar19 = pbVar19 + 1;
                        if (fVar34 <= fVar40) {
                          fVar40 = fVar34;
                        }
                        fVar34 = fVar40;
                      } while (pbVar19 < pbVar4 + lVar30);
                    }
                    if (map_indexes) {
                      *puVar15 = (uint)*pbVar26;
                      *puVar10 = (uint)pbVar26[lVar30];
                      puVar10 = puVar10 + 1;
                    }
                    else {
                      *puVar15 = (int)pbVar26 - (int)pbVar4;
                    }
                    pbVar24 = pbVar24 + 1;
                    pbVar23 = pbVar23 + 1;
                    puVar15 = puVar15 + 1;
                  } while (pbVar24 < pbVar21);
                }
                lVar13 = lVar13 + 1;
                uVar28 = (ulong)(int)this->_height;
              } while (lVar13 < (long)uVar28);
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 < (int)this->_depth);
          return __return_storage_ptr__;
        }
      }
    }
  }
  __return_storage_ptr__->_data = (uint *)0x0;
  __return_storage_ptr__->_width = 0;
  __return_storage_ptr__->_height = 0;
  __return_storage_ptr__->_depth = 0;
  __return_storage_ptr__->_spectrum = 0;
  __return_storage_ptr__->_is_shared = false;
  return __return_storage_ptr__;
}

Assistant:

CImg<typename CImg<t>::Tuint>
    get_index(const CImg<t>& colormap, const float dithering=1, const bool map_indexes=true) const {
      if (colormap._spectrum!=_spectrum)
        throw CImgArgumentException(_cimg_instance
                                    "index(): Instance and specified colormap (%u,%u,%u,%u,%p) "
                                    "have incompatible dimensions.",
                                    cimg_instance,
                                    colormap._width,colormap._height,colormap._depth,colormap._spectrum,colormap._data);

      typedef typename CImg<t>::Tuint tuint;
      if (is_empty()) return CImg<tuint>();
      const ulongT
        whd = (ulongT)_width*_height*_depth,
        pwhd = (ulongT)colormap._width*colormap._height*colormap._depth;
      CImg<tuint> res(_width,_height,_depth,map_indexes?_spectrum:1);
      if (dithering>0) { // Dithered versions
        tuint *ptrd = res._data;
        const float ndithering = cimg::cut(dithering,0,1)/16;
        Tfloat valm = 0, valM = (Tfloat)max_min(valm);
        if (valm==valM && valm>=0 && valM<=255) { valm = 0; valM = 255; }
        CImg<Tfloat> cache = get_crop(-1,0,0,0,_width,1,0,_spectrum - 1);
        Tfloat *cache_current = cache.data(1,0,0,0), *cache_next = cache.data(1,1,0,0);
        const ulongT cwhd = (ulongT)cache._width*cache._height*cache._depth;
        switch (_spectrum) {
        case 1 : { // Optimized for scalars
          cimg_forYZ(*this,y,z) {
            if (y<height() - 2) {
              Tfloat *ptrc0 = cache_next; const T *ptrs0 = data(0,y + 1,z,0);
              cimg_forX(*this,x) *(ptrc0++) = (Tfloat)*(ptrs0++);
            }
            Tfloat *ptrs0 = cache_current, *ptrsn0 = cache_next;
            cimg_forX(*this,x) {
              const Tfloat _val0 = (Tfloat)*ptrs0, val0 = _val0<valm?valm:_val0>valM?valM:_val0;
              Tfloat distmin = cimg::type<Tfloat>::max(); const t *ptrmin0 = colormap._data;
              for (const t *ptrp0 = colormap._data, *ptrp_end = ptrp0 + pwhd; ptrp0<ptrp_end; ) {
                const Tfloat pval0 = (Tfloat)*(ptrp0++) - val0, dist = pval0*pval0;
                if (dist<distmin) { ptrmin0 = ptrp0 - 1; distmin = dist; }
              }
              const Tfloat err0 = ((*(ptrs0++)=val0) - (Tfloat)*ptrmin0)*ndithering;
              *ptrs0+=7*err0; *(ptrsn0 - 1)+=3*err0; *(ptrsn0++)+=5*err0; *ptrsn0+=err0;
              if (map_indexes) *(ptrd++) = (tuint)*ptrmin0; else *(ptrd++) = (tuint)(ptrmin0 - colormap._data);
            }
            cimg::swap(cache_current,cache_next);
          }
        } break;
        case 2 : { // Optimized for 2D vectors
          tuint *ptrd1 = ptrd + whd;
          cimg_forYZ(*this,y,z) {
            if (y<height() - 2) {
              Tfloat *ptrc0 = cache_next, *ptrc1 = ptrc0 + cwhd;
              const T *ptrs0 = data(0,y + 1,z,0), *ptrs1 = ptrs0 + whd;
              cimg_forX(*this,x) { *(ptrc0++) = (Tfloat)*(ptrs0++); *(ptrc1++) = (Tfloat)*(ptrs1++); }
            }
            Tfloat
              *ptrs0 = cache_current, *ptrs1 = ptrs0 + cwhd,
              *ptrsn0 = cache_next, *ptrsn1 = ptrsn0 + cwhd;
            cimg_forX(*this,x) {
              const Tfloat
                _val0 = (Tfloat)*ptrs0, val0 = _val0<valm?valm:_val0>valM?valM:_val0,
                _val1 = (Tfloat)*ptrs1, val1 = _val1<valm?valm:_val1>valM?valM:_val1;
              Tfloat distmin = cimg::type<Tfloat>::max(); const t *ptrmin0 = colormap._data;
              for (const t *ptrp0 = colormap._data, *ptrp1 = ptrp0 + pwhd, *ptrp_end = ptrp1; ptrp0<ptrp_end; ) {
                const Tfloat
                  pval0 = (Tfloat)*(ptrp0++) - val0, pval1 = (Tfloat)*(ptrp1++) - val1,
                  dist = pval0*pval0 + pval1*pval1;
                if (dist<distmin) { ptrmin0 = ptrp0 - 1; distmin = dist; }
              }
              const t *const ptrmin1 = ptrmin0 + pwhd;
              const Tfloat
                err0 = ((*(ptrs0++)=val0) - (Tfloat)*ptrmin0)*ndithering,
                err1 = ((*(ptrs1++)=val1) - (Tfloat)*ptrmin1)*ndithering;
              *ptrs0+=7*err0; *ptrs1+=7*err1;
              *(ptrsn0 - 1)+=3*err0; *(ptrsn1 - 1)+=3*err1;
              *(ptrsn0++)+=5*err0; *(ptrsn1++)+=5*err1;
              *ptrsn0+=err0; *ptrsn1+=err1;
              if (map_indexes) { *(ptrd++) = (tuint)*ptrmin0; *(ptrd1++) = (tuint)*ptrmin1; }
              else *(ptrd++) = (tuint)(ptrmin0 - colormap._data);
            }
            cimg::swap(cache_current,cache_next);
          }
        } break;
        case 3 : { // Optimized for 3D vectors (colors)
          tuint *ptrd1 = ptrd + whd, *ptrd2 = ptrd1 + whd;
          cimg_forYZ(*this,y,z) {
            if (y<height() - 2) {
              Tfloat *ptrc0 = cache_next, *ptrc1 = ptrc0 + cwhd, *ptrc2 = ptrc1 + cwhd;
              const T *ptrs0 = data(0,y + 1,z,0), *ptrs1 = ptrs0 + whd, *ptrs2 = ptrs1 + whd;
              cimg_forX(*this,x) {
                *(ptrc0++) = (Tfloat)*(ptrs0++); *(ptrc1++) = (Tfloat)*(ptrs1++); *(ptrc2++) = (Tfloat)*(ptrs2++);
              }
            }
            Tfloat
              *ptrs0 = cache_current, *ptrs1 = ptrs0 + cwhd, *ptrs2 = ptrs1 + cwhd,
              *ptrsn0 = cache_next, *ptrsn1 = ptrsn0 + cwhd, *ptrsn2 = ptrsn1 + cwhd;
            cimg_forX(*this,x) {
              const Tfloat
                _val0 = (Tfloat)*ptrs0, val0 = _val0<valm?valm:_val0>valM?valM:_val0,
                _val1 = (Tfloat)*ptrs1, val1 = _val1<valm?valm:_val1>valM?valM:_val1,
                _val2 = (Tfloat)*ptrs2, val2 = _val2<valm?valm:_val2>valM?valM:_val2;
              Tfloat distmin = cimg::type<Tfloat>::max(); const t *ptrmin0 = colormap._data;
              for (const t *ptrp0 = colormap._data, *ptrp1 = ptrp0 + pwhd, *ptrp2 = ptrp1 + pwhd,
                     *ptrp_end = ptrp1; ptrp0<ptrp_end; ) {
                const Tfloat
                  pval0 = (Tfloat)*(ptrp0++) - val0,
                  pval1 = (Tfloat)*(ptrp1++) - val1,
                  pval2 = (Tfloat)*(ptrp2++) - val2,
                  dist = pval0*pval0 + pval1*pval1 + pval2*pval2;
                if (dist<distmin) { ptrmin0 = ptrp0 - 1; distmin = dist; }
              }
              const t *const ptrmin1 = ptrmin0 + pwhd, *const ptrmin2 = ptrmin1 + pwhd;
              const Tfloat
                err0 = ((*(ptrs0++)=val0) - (Tfloat)*ptrmin0)*ndithering,
                err1 = ((*(ptrs1++)=val1) - (Tfloat)*ptrmin1)*ndithering,
                err2 = ((*(ptrs2++)=val2) - (Tfloat)*ptrmin2)*ndithering;

              *ptrs0+=7*err0; *ptrs1+=7*err1; *ptrs2+=7*err2;
              *(ptrsn0 - 1)+=3*err0; *(ptrsn1 - 1)+=3*err1; *(ptrsn2 - 1)+=3*err2;
              *(ptrsn0++)+=5*err0; *(ptrsn1++)+=5*err1; *(ptrsn2++)+=5*err2;
              *ptrsn0+=err0; *ptrsn1+=err1; *ptrsn2+=err2;

              if (map_indexes) {
                *(ptrd++) = (tuint)*ptrmin0; *(ptrd1++) = (tuint)*ptrmin1; *(ptrd2++) = (tuint)*ptrmin2;
              } else *(ptrd++) = (tuint)(ptrmin0 - colormap._data);
            }
            cimg::swap(cache_current,cache_next);
          }
        } break;
        default : // Generic version
          cimg_forYZ(*this,y,z) {
            if (y<height() - 2) {
              Tfloat *ptrc = cache_next;
              cimg_forC(*this,c) {
                Tfloat *_ptrc = ptrc; const T *_ptrs = data(0,y + 1,z,c);
                cimg_forX(*this,x) *(_ptrc++) = (Tfloat)*(_ptrs++);
                ptrc+=cwhd;
              }
            }
            Tfloat *ptrs = cache_current, *ptrsn = cache_next;
            cimg_forX(*this,x) {
              Tfloat distmin = cimg::type<Tfloat>::max(); const t *ptrmin = colormap._data;
              for (const t *ptrp = colormap._data, *ptrp_end = ptrp + pwhd; ptrp<ptrp_end; ++ptrp) {
                Tfloat dist = 0; Tfloat *_ptrs = ptrs; const t *_ptrp = ptrp;
                cimg_forC(*this,c) {
                  const Tfloat _val = *_ptrs, val = _val<valm?valm:_val>valM?valM:_val;
                  dist+=cimg::sqr((*_ptrs=val) - (Tfloat)*_ptrp); _ptrs+=cwhd; _ptrp+=pwhd;
                }
                if (dist<distmin) { ptrmin = ptrp; distmin = dist; }
              }
              const t *_ptrmin = ptrmin; Tfloat *_ptrs = ptrs++, *_ptrsn = (ptrsn++) - 1;
              cimg_forC(*this,c) {
                const Tfloat err = (*(_ptrs++) - (Tfloat)*_ptrmin)*ndithering;
                *_ptrs+=7*err; *(_ptrsn++)+=3*err; *(_ptrsn++)+=5*err; *_ptrsn+=err;
                _ptrmin+=pwhd; _ptrs+=cwhd - 1; _ptrsn+=cwhd - 2;
              }
              if (map_indexes) {
                tuint *_ptrd = ptrd++;
                cimg_forC(*this,c) { *_ptrd = (tuint)*ptrmin; _ptrd+=whd; ptrmin+=pwhd; }
              }
              else *(ptrd++) = (tuint)(ptrmin - colormap._data);
            }
            cimg::swap(cache_current,cache_next);
          }
        }